

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genkat.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int extraout_EAX;
  ulong uVar2;
  undefined4 uVar3;
  char *__s1;
  uchar secret [8];
  uchar ad [12];
  uchar salt [16];
  uchar pwd [32];
  uchar out [32];
  undefined8 local_100;
  undefined8 local_f8;
  undefined4 local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8 [40];
  undefined1 *local_90;
  undefined4 local_88;
  undefined8 *local_80;
  undefined4 local_78;
  undefined8 *local_70;
  undefined4 local_68;
  undefined8 *local_60;
  undefined4 local_58;
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  int local_34;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined4 local_20;
  
  if (argc < 2) {
    __s1 = "i";
  }
  else {
    __s1 = argv[1];
  }
  iVar1 = strcmp(__s1,"d");
  if (iVar1 != 0) {
    iVar1 = strcmp(__s1,"i");
    if (iVar1 == 0) {
      uVar3 = 1;
      goto LAB_0010123a;
    }
    iVar1 = strcmp(__s1,"id");
    uVar3 = 2;
    if (iVar1 == 0) goto LAB_0010123a;
    main_cold_1();
  }
  uVar3 = 0;
LAB_0010123a:
  local_34 = 0x13;
  if (2 < argc) {
    uVar2 = strtoul(argv[2],(char **)0x0,10);
    local_34 = (int)uVar2;
  }
  if ((local_34 != 0x10) && (local_34 != 0x13)) {
    main_cold_2();
    return extraout_EAX;
  }
  local_80 = &local_d8;
  local_d8 = 0x101010101010101;
  uStack_d0 = 0x101010101010101;
  local_c8 = 0x101010101010101;
  uStack_c0 = 0x101010101010101;
  local_70 = &local_e8;
  local_e8 = 0x202020202020202;
  uStack_e0 = 0x202020202020202;
  local_60 = &local_100;
  local_100 = 0x303030303030303;
  local_50 = &local_f8;
  local_f8 = 0x404040404040404;
  local_f0 = 0x4040404;
  local_90 = local_b8;
  local_88 = 0x20;
  local_78 = 0x20;
  local_68 = 0x10;
  local_58 = 8;
  local_48 = 0x30000000c;
  uStack_40 = 0x400000020;
  local_38 = 4;
  local_30 = 0;
  uStack_28 = 0;
  local_20 = 8;
  argon2_ctx(&local_90,uVar3);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    /* Get and check Argon2 type */
    const char *type_str = (argc > 1) ? argv[1] : "i";
    argon2_type type = Argon2_i;
    uint32_t version = ARGON2_VERSION_NUMBER;
    if (!strcmp(type_str, "d")) {
        type = Argon2_d;
    } else if (!strcmp(type_str, "i")) {
        type = Argon2_i;
    } else if (!strcmp(type_str, "id")) {
        type = Argon2_id;
    } else {
        fatal("wrong Argon2 type");
    }

    /* Get and check Argon2 version number */
    if(argc > 2) {
        version = strtoul(argv[2], NULL, 10);
    }
    if (ARGON2_VERSION_10 != version && ARGON2_VERSION_NUMBER != version) {
        fatal("wrong Argon2 version number");
    }

    generate_testvectors(type, version);
    return ARGON2_OK;
}